

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

float Abc_NtkDelayTraceLut(Abc_Ntk_t *pNtk,int fUseLutLib)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  void **ppvVar5;
  int *piVar6;
  size_t __size;
  bool bVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  float *pfVar11;
  Vec_Ptr_t *pVVar12;
  Abc_Ntk_t *pAVar13;
  float *pfVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_138 [32];
  float local_b8 [34];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                  ,0x6f,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
  }
  bVar7 = true;
  if ((fUseLutLib == 0) || (pvVar10 = Abc_FrameReadLibLut(), pvVar10 == (void *)0x0)) {
    pvVar10 = (void *)0x0;
  }
  else {
    iVar1 = *(int *)((long)pvVar10 + 8);
    iVar8 = Abc_NtkGetFaninMax(pNtk);
    if (iVar1 < iVar8) {
      uVar2 = *(uint *)((long)pvVar10 + 8);
      uVar9 = Abc_NtkGetFaninMax(pNtk);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar2,
             (ulong)uVar9);
      return -1e+09;
    }
    bVar7 = false;
  }
  if (pNtk->pLutTimes != (float *)0x0) {
    free(pNtk->pLutTimes);
  }
  lVar17 = (long)pNtk->vObjs->nSize;
  __size = lVar17 * 0xc;
  pfVar11 = (float *)malloc(__size);
  pNtk->pLutTimes = pfVar11;
  if (0 < lVar17) {
    sVar15 = 0;
    do {
      *(undefined4 *)((long)pfVar11 + sVar15 + 8) = 0;
      *(undefined8 *)((long)pfVar11 + sVar15) = 0x4e6e6b2800000000;
      sVar15 = sVar15 + 0xc;
    } while (__size != sVar15);
  }
  pVVar12 = Abc_NtkDfs(pNtk,1);
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar12->pArray[lVar17];
      if (bVar7) {
        uVar9 = (pAVar3->vFanins).nSize;
        pAVar13 = pAVar3->pNtk;
        if ((long)(int)uVar9 < 1) goto LAB_00311d04;
        lVar18 = 0;
        fVar23 = -1e+09;
        do {
          plVar4 = (long *)pAVar13->vObjs->pArray[(pAVar3->vFanins).pArray[lVar18]];
          fVar24 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc);
          fVar25 = fVar24 + 1.0;
          if (fVar24 + 1.0 <= fVar23) {
            fVar25 = fVar23;
          }
          fVar23 = fVar25;
          lVar18 = lVar18 + 1;
        } while ((int)uVar9 != lVar18);
      }
      else {
        uVar2 = (pAVar3->vFanins).nSize;
        if (*(int *)((long)pvVar10 + 0xc) == 0) {
          pAVar13 = pAVar3->pNtk;
          uVar9 = uVar2;
          if ((int)uVar2 < 1) goto LAB_00311d04;
          uVar19 = 0;
          fVar24 = -1e+09;
          do {
            plVar4 = (long *)pAVar13->vObjs->pArray[(pAVar3->vFanins).pArray[uVar19]];
            fVar23 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
                     *(float *)((long)pvVar10 + (ulong)uVar2 * 0x84 + 0x94);
            if (fVar23 <= fVar24) {
              fVar23 = fVar24;
            }
            uVar19 = uVar19 + 1;
            fVar24 = fVar23;
          } while (uVar2 != uVar19);
        }
        else {
          Abc_NtkDelayTraceSortPins(pAVar3,local_138,local_b8);
          uVar9 = (pAVar3->vFanins).nSize;
          pAVar13 = pAVar3->pNtk;
          if ((long)(int)uVar9 < 1) {
LAB_00311d04:
            if (uVar9 == 0) {
              fVar23 = 0.0;
            }
            else {
              fVar23 = -1e+09;
            }
          }
          else {
            lVar18 = 0;
            fVar24 = -1e+09;
            do {
              plVar4 = (long *)pAVar13->vObjs->pArray[(pAVar3->vFanins).pArray[local_138[lVar18]]];
              fVar23 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc) +
                       *(float *)((long)pvVar10 + lVar18 * 4 + (long)(int)uVar2 * 0x84 + 0x94);
              if (fVar23 <= fVar24) {
                fVar23 = fVar24;
              }
              lVar18 = lVar18 + 1;
              fVar24 = fVar23;
            } while ((int)uVar9 != lVar18);
          }
        }
      }
      pAVar13->pLutTimes[(long)pAVar3->Id * 3] = fVar23;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar12->nSize);
  }
  if (pVVar12->pArray != (void **)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  pVVar12 = pNtk->vCos;
  lVar17 = (long)pVVar12->nSize;
  if (lVar17 < 1) {
    fVar24 = -1e+09;
  }
  else {
    fVar24 = -1e+09;
    lVar18 = 0;
    do {
      plVar4 = *(long **)(*(long *)(*(long *)(*pVVar12->pArray[lVar18] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar12->pArray[lVar18] + 0x20) * 8);
      fVar23 = *(float *)(*(long *)(*plVar4 + 400) + (long)(int)plVar4[2] * 0xc);
      if (fVar23 <= fVar24) {
        fVar23 = fVar24;
      }
      fVar24 = fVar23;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
    if (0 < pVVar12->nSize) {
      ppvVar5 = pVVar12->pArray;
      lVar18 = 0;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(*ppvVar5[lVar18] + 0x20) + 8) +
                           (long)**(int **)((long)ppvVar5[lVar18] + 0x20) * 8);
        lVar20 = (long)(int)plVar4[2];
        lVar16 = *(long *)(*plVar4 + 400);
        if (fVar24 < *(float *)(lVar16 + 4 + lVar20 * 0xc)) {
          *(float *)(lVar16 + 4 + lVar20 * 0xc) = fVar24;
        }
        lVar18 = lVar18 + 1;
      } while (lVar17 != lVar18);
    }
  }
  pVVar12 = Abc_NtkDfsReverse(pNtk);
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar12->pArray[lVar17];
      if (bVar7) {
        pfVar14 = pAVar3->pNtk->pLutTimes;
        lVar18 = (long)pAVar3->Id * 3;
        fVar23 = pfVar14[(long)pAVar3->Id * 3 + 1];
        lVar16 = (long)(pAVar3->vFanins).nSize;
        if (0 < lVar16) {
          piVar6 = (pAVar3->vFanins).pArray;
          ppvVar5 = pAVar3->pNtk->vObjs->pArray;
          lVar20 = 0;
          do {
            plVar4 = (long *)ppvVar5[piVar6[lVar20]];
            lVar21 = (long)(int)plVar4[2];
            lVar22 = *(long *)(*plVar4 + 400);
            if (fVar23 + -1.0 < *(float *)(lVar22 + 4 + lVar21 * 0xc)) {
              *(float *)(lVar22 + 4 + lVar21 * 0xc) = fVar23 + -1.0;
            }
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
      }
      else {
        iVar1 = (pAVar3->vFanins).nSize;
        pfVar11 = (float *)((long)pvVar10 + (long)iVar1 * 0x84 + 0x94);
        if (*(int *)((long)pvVar10 + 0xc) == 0) {
          pfVar14 = pAVar3->pNtk->pLutTimes;
          lVar18 = (long)pAVar3->Id * 3;
          if (0 < iVar1) {
            fVar23 = pfVar14[(long)pAVar3->Id * 3 + 1] - *pfVar11;
            piVar6 = (pAVar3->vFanins).pArray;
            ppvVar5 = pAVar3->pNtk->vObjs->pArray;
            lVar16 = 0;
            do {
              plVar4 = (long *)ppvVar5[piVar6[lVar16]];
              lVar22 = (long)(int)plVar4[2];
              lVar20 = *(long *)(*plVar4 + 400);
              if (fVar23 < *(float *)(lVar20 + 4 + lVar22 * 0xc)) {
                *(float *)(lVar20 + 4 + lVar22 * 0xc) = fVar23;
              }
              lVar16 = lVar16 + 1;
            } while (iVar1 != lVar16);
          }
        }
        else {
          Abc_NtkDelayTraceSortPins(pAVar3,local_138,local_b8);
          lVar16 = (long)(pAVar3->vFanins).nSize;
          pAVar13 = pAVar3->pNtk;
          if (lVar16 < 1) {
            pfVar14 = pAVar13->pLutTimes;
            lVar18 = (long)pAVar3->Id * 3;
          }
          else {
            piVar6 = (pAVar3->vFanins).pArray;
            pfVar14 = pAVar13->pLutTimes;
            ppvVar5 = pAVar13->vObjs->pArray;
            iVar1 = pAVar3->Id;
            lVar18 = (long)iVar1 * 3;
            lVar20 = 0;
            do {
              fVar23 = pfVar14[(long)iVar1 * 3 + 1] - pfVar11[lVar20];
              plVar4 = (long *)ppvVar5[piVar6[local_138[lVar20]]];
              lVar21 = (long)(int)plVar4[2];
              lVar22 = *(long *)(*plVar4 + 400);
              if (fVar23 < *(float *)(lVar22 + 4 + lVar21 * 0xc)) {
                *(float *)(lVar22 + 4 + lVar21 * 0xc) = fVar23;
              }
              lVar20 = lVar20 + 1;
            } while (lVar16 != lVar20);
          }
        }
      }
      fVar23 = pfVar14[lVar18 + 1] - pfVar14[lVar18];
      if (fVar23 + 0.001 <= 0.0) {
        __assert_fail("tSlack + 0.001 > 0.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSpeedup.c"
                      ,0xe2,"float Abc_NtkDelayTraceLut(Abc_Ntk_t *, int)");
      }
      fVar25 = 0.0;
      if (0.0 <= fVar23) {
        fVar25 = fVar23;
      }
      pfVar14[lVar18 + 2] = fVar25;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar12->nSize);
  }
  if (pVVar12->pArray != (void **)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  return fVar24;
}

Assistant:

float Abc_NtkDelayTraceLut( Abc_Ntk_t * pNtk, int fUseLutLib )
{
    int fUseSorting = 1;
    int pPinPerm[32];
    float pPinDelays[32];
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    float tArrival, tRequired, tSlack, * pDelays;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = fUseLutLib?  (If_LibLut_t *)Abc_FrameReadLibLut() : NULL;
    if ( pLutLib && pLutLib->LutMax < Abc_NtkGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Abc_NtkGetFaninMax(pNtk) );
        return -ABC_INFINITY;
    }

    // initialize the arrival times
    ABC_FREE( pNtk->pLutTimes );
    pNtk->pLutTimes = ABC_ALLOC( float, 3 * Abc_NtkObjNumMax(pNtk) );
    for ( i = 0; i < Abc_NtkObjNumMax(pNtk); i++ )
    {
        pNtk->pLutTimes[3*i+0] = pNtk->pLutTimes[3*i+2] = 0;
        pNtk->pLutTimes[3*i+1] = ABC_INFINITY;
    }

    // propagate arrival times
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        tArrival = -ABC_INFINITY;
        if ( pLutLib == NULL )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + 1.0 )
                    tArrival = Abc_ObjArrival(pFanin) + 1.0;
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[0] )
                    tArrival = Abc_ObjArrival(pFanin) + pDelays[0];
        }
        else
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k ) 
                    if ( tArrival < Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k] )
                        tArrival = Abc_ObjArrival(Abc_ObjFanin(pNode,pPinPerm[k])) + pDelays[k];
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                    if ( tArrival < Abc_ObjArrival(pFanin) + pDelays[k] )
                        tArrival = Abc_ObjArrival(pFanin) + pDelays[k];
            }
        }
        if ( Abc_ObjFaninNum(pNode) == 0 )
            tArrival = 0.0;
        Abc_ObjSetArrival( pNode, tArrival );
    }
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrival = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( tArrival < Abc_ObjArrival(Abc_ObjFanin0(pNode)) )
            tArrival = Abc_ObjArrival(Abc_ObjFanin0(pNode));

    // initialize the required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( Abc_ObjRequired(Abc_ObjFanin0(pNode)) > tArrival )
            Abc_ObjSetRequired( Abc_ObjFanin0(pNode), tArrival );

    // propagate the required times
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pLutLib == NULL )
        {
            tRequired = Abc_ObjRequired(pNode) - (float)1.0;
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else if ( !pLutLib->fVarPinDelays )
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            tRequired = Abc_ObjRequired(pNode) - pDelays[0];
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( Abc_ObjRequired(pFanin) > tRequired )
                    Abc_ObjSetRequired( pFanin, tRequired );
        }
        else 
        {
            pDelays = pLutLib->pLutDelays[Abc_ObjFaninNum(pNode)];
            if ( fUseSorting )
            {
                Abc_NtkDelayTraceSortPins( pNode, pPinPerm, pPinDelays );
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(Abc_ObjFanin(pNode,pPinPerm[k])) > tRequired )
                        Abc_ObjSetRequired( Abc_ObjFanin(pNode,pPinPerm[k]), tRequired );
                }
            }
            else
            {
                Abc_ObjForEachFanin( pNode, pFanin, k )
                {
                    tRequired = Abc_ObjRequired(pNode) - pDelays[k];
                    if ( Abc_ObjRequired(pFanin) > tRequired )
                        Abc_ObjSetRequired( pFanin, tRequired );
                }
            }
        }
        // set slack for this object
        tSlack = Abc_ObjRequired(pNode) - Abc_ObjArrival(pNode);
        assert( tSlack + 0.001 > 0.0 );
        Abc_ObjSetSlack( pNode, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_PtrFree( vNodes );
    return tArrival;
}